

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

ostream * Kernel::operator<<(ostream *out,Symbol *self)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(self->_name)._M_dataplus._M_p,(self->_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (self->_type == (OperatorType *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<type not (yet) set>",0x14);
  }
  else {
    operator<<(out,self->_type);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signature::Symbol& self)
    { 
      out << self.name() << ": "; 
      if (self._type) {
        out << *self._type;
      } else {
        out << "<type not (yet) set>";
      }
      return out;
    }